

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::h_CFROUND(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *this_00;
  char *__s;
  char cVar1;
  size_t sVar2;
  long *plVar3;
  uint uVar4;
  
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tmov rax, ",10);
  __s = *(char **)(regR + (ulong)instr->src * 8);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  cVar1 = (char)this_00;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar4 = 0xd - instr->imm32 & 0x3f;
  if (uVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\trol rax, ",10);
    plVar3 = (long *)std::ostream::operator<<(this_00,uVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tand eax, 24576",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tor eax, 40896",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tpush rax",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\tldmxcsr dword ptr [rsp]",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tpop rax",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CFROUND(Instruction& instr, int i) {
		asmCode << "\tmov rax, " << regR[instr.src] << std::endl;
		int rotate = (13 - (instr.getImm32() & 63)) & 63;
		if (rotate != 0)
			asmCode << "\trol rax, " << rotate << std::endl;
		asmCode << "\tand eax, 24576" << std::endl;
		asmCode << "\tor eax, 40896" << std::endl;
		asmCode << "\tpush rax" << std::endl;
		asmCode << "\tldmxcsr dword ptr [rsp]" << std::endl;
		asmCode << "\tpop rax" << std::endl;
		tracenop(instr);
	}